

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O3

void ssh2channel_unthrottle(SshChannel *sc,size_t bufsize)

{
  int iVar1;
  SshChannelVtable *pSVar2;
  ulong uVar3;
  
  pSVar2 = sc[-0xb].vt;
  if (*(char *)&pSVar2->send_exit_signal_numeric == '\0') {
    iVar1 = *(int *)((long)&sc[-4].cl + 4);
    uVar3 = (ulong)iVar1;
    if (bufsize < uVar3) {
      ssh2_set_window((ssh2_channel *)(sc + -0xb),iVar1 - (int)bufsize);
    }
  }
  else {
    uVar3 = 0;
  }
  if ((bufsize <= uVar3) && (*(char *)((long)&sc[-10].cl + 5) != '\0')) {
    *(undefined1 *)((long)&sc[-10].cl + 5) = 0;
    ssh_throttle_conn((Ssh *)pSVar2[1].send_terminal_size_change,-1);
    return;
  }
  return;
}

Assistant:

static void ssh2channel_unthrottle(SshChannel *sc, size_t bufsize)
{
    struct ssh2_channel *c = container_of(sc, struct ssh2_channel, sc);
    struct ssh2_connection_state *s = c->connlayer;
    size_t buflimit;

    buflimit = s->ssh_is_simple ? 0 : c->locmaxwin;
    if (bufsize < buflimit)
        ssh2_set_window(c, buflimit - bufsize);

    if (c->throttling_conn && bufsize <= buflimit) {
        c->throttling_conn = false;
        ssh_throttle_conn(s->ppl.ssh, -1);
    }
}